

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O1

void __thiscall pass_insert_clk_en_Test::TestBody(pass_insert_clk_en_Test *this)

{
  _Rb_tree_header *p_Var1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  size_type *psVar3;
  size_type *psVar4;
  size_type *psVar5;
  pointer pcVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  IfStmt *this_00;
  size_t this_01;
  Generator *pGVar8;
  Port *pPVar9;
  Port *pPVar10;
  Port *pPVar11;
  Var *pVVar12;
  Generator *this_02;
  Port *pPVar13;
  Const *right;
  Generator *this_03;
  Port *__args;
  iterator iVar14;
  mapped_type *pmVar15;
  long lVar16;
  Generator *top;
  char *expected_predicate_value;
  pointer *__ptr;
  undefined1 local_2c0 [8];
  Context c;
  shared_ptr<kratos::SequentialStmtBlock> child_seq3;
  shared_ptr<kratos::SequentialStmtBlock> seq;
  shared_ptr<kratos::SequentialStmtBlock> child_seq;
  shared_ptr<kratos::SequentialStmtBlock> child_seq2;
  IfStmt *local_138;
  shared_ptr<kratos::IfStmt> if_child2;
  shared_ptr<kratos::IfStmt> if_child3;
  shared_ptr<kratos::IfStmt> if_;
  AssertionResult gtest_ar__4;
  mapped_type child_src2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  undefined1 auStack_a8 [8];
  mapped_type child_src;
  mapped_type parent_src;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  
  local_2c0 = (undefined1  [8])&c.modules_._M_h._M_rehash_policy._M_next_resize;
  c.modules_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.modules_._M_h._M_bucket_count = 0;
  c.modules_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.modules_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.modules_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.modules_._M_h._M_rehash_policy._4_4_ = 0;
  c.modules_._M_h._M_rehash_policy._M_next_resize = 0;
  c.modules_._M_h._M_single_bucket =
       (__node_base_ptr)&c.generator_hash_._M_h._M_rehash_policy._M_next_resize;
  c.generator_hash_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.generator_hash_._M_h._M_bucket_count = 0;
  c.generator_hash_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.generator_hash_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&c.enum_defs_;
  c.enum_defs_._M_t._M_impl._0_4_ = 0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.generator_hash_._M_h._M_rehash_policy._4_4_ = 0;
  c.generator_hash_._M_h._M_rehash_policy._M_next_resize = 0;
  c.generator_hash_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&c.empty_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.empty_generators_._M_h._M_bucket_count = 0;
  c.empty_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.empty_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c._224_8_ = &c.tracked_generators_._M_h._M_rehash_policy._M_next_resize;
  c.empty_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.empty_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.empty_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  c.empty_generators_._M_h._M_single_bucket._0_1_ = 0;
  c.tracked_generators_._M_h._M_buckets = (__buckets_ptr)0x1;
  c.tracked_generators_._M_h._M_bucket_count = 0;
  c.tracked_generators_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  c.tracked_generators_._M_h._M_element_count._0_4_ = 0x3f800000;
  c.tracked_generators_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  c.tracked_generators_._M_h._M_rehash_policy._4_4_ = 0;
  c.tracked_generators_._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var1 = &src._M_t._M_impl.super__Rb_tree_header;
  c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"parent","");
  pGVar8 = kratos::Context::generator
                     ((Context *)local_2c0,(string *)((long)&parent_src.field_2 + 8));
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk","");
  pPVar9 = kratos::Generator::port
                     (pGVar8,In,(string *)((long)&parent_src.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"rst","");
  src._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pGVar8;
  pPVar10 = kratos::Generator::port
                      (pGVar8,In,(string *)((long)&parent_src.field_2 + 8),1,1,AsyncReset,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&parent_src.field_2 + 8),"a","");
  pPVar11 = kratos::Generator::port
                      ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,Out,
                       (string *)((long)&parent_src.field_2 + 8),1,1);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::sequential
            ((Generator *)
             &child_seq3.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  _Var7 = child_seq3.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar9->super_Var).super_enable_shared_from_this<kratos::Var>);
  parent_src.field_2._8_8_ = parent_src.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var7._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  _Var7._M_pi = child_seq3.
                super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar10->super_Var).super_enable_shared_from_this<kratos::Var>);
  parent_src.field_2._8_8_ = parent_src.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var7._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_,
             (IfStmt **)
             &if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (allocator<kratos::IfStmt> *)((long)&parent_src.field_2 + 8),pPVar10);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             &if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (IfStmt *)
             if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  _Var7 = if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)((long)&child_src.field_2 + 8),&pPVar11->super_Var);
  parent_src.field_2._8_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)_Var7._M_pi,(shared_ptr<kratos::Stmt> *)((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  _Var7._M_pi = if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&child_src.field_2 + 8),&pPVar11->super_Var);
  parent_src.field_2._8_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)_Var7._M_pi,(shared_ptr<kratos::Stmt> *)((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  parent_src.field_2._8_8_ =
       if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  src._M_t._M_impl._0_8_ = if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             child_seq3.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"child","");
  pGVar8 = kratos::Context::generator
                     ((Context *)local_2c0,(string *)((long)&parent_src.field_2 + 8));
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk","");
  pPVar10 = kratos::Generator::port
                      (pGVar8,In,(string *)((long)&parent_src.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::sequential
            ((Generator *)
             &seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var7 = seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar10->super_Var).super_enable_shared_from_this<kratos::Var>);
  parent_src.field_2._8_8_ = parent_src.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var7._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  _Var7._M_pi = seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&parent_src.field_2 + 8),"a","");
  pVVar12 = kratos::Generator::var(pGVar8,(string *)((long)&parent_src.field_2 + 8),1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)auStack_a8,pVVar12);
  child_src.field_2._8_8_ = auStack_a8;
  parent_src._M_dataplus = child_src._M_dataplus;
  auStack_a8 = (undefined1  [8])0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)_Var7._M_pi,(shared_ptr<kratos::Stmt> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&parent_src.field_2 + 8),"b","");
  pVVar12 = kratos::Generator::var(pGVar8,(string *)((long)&parent_src.field_2 + 8),1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)auStack_a8,pVVar12);
  child_src.field_2._8_8_ = auStack_a8;
  parent_src._M_dataplus = child_src._M_dataplus;
  auStack_a8 = (undefined1  [8])0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"child2","");
  this_02 = kratos::Context::generator
                      ((Context *)local_2c0,(string *)((long)&parent_src.field_2 + 8));
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk","");
  pPVar11 = kratos::Generator::port
                      (this_02,In,(string *)((long)&parent_src.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk_en","");
  pPVar13 = kratos::Generator::port
                      (this_02,In,(string *)((long)&parent_src.field_2 + 8),1,1,ClockEnable,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  right = kratos::Const::constant(1,1,false);
  kratos::Generator::wire(this_02,&pPVar13->super_Var,&right->super_Var);
  kratos::Generator::sequential
            ((Generator *)
             &child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var7 = child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar11->super_Var).super_enable_shared_from_this<kratos::Var>);
  parent_src.field_2._8_8_ = parent_src.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)_Var7._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  local_138 = (IfStmt *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_child2,&local_138,
             (allocator<kratos::IfStmt> *)((long)&parent_src.field_2 + 8),pPVar13);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)&local_138,local_138);
  this_00 = local_138;
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&parent_src.field_2 + 8),"a","");
  pVVar12 = kratos::Generator::var(this_02,(string *)((long)&parent_src.field_2 + 8),1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)auStack_a8,pVVar12);
  child_src.field_2._8_8_ = auStack_a8;
  parent_src._M_dataplus = child_src._M_dataplus;
  auStack_a8 = (undefined1  [8])0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt(this_00,(shared_ptr<kratos::Stmt> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = local_138;
  src._M_t._M_impl._0_8_ =
       if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)
             child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,(shared_ptr<kratos::Stmt> *)((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"child3","");
  this_03 = kratos::Context::generator
                      ((Context *)local_2c0,(string *)((long)&parent_src.field_2 + 8));
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk","");
  pPVar13 = kratos::Generator::port
                      (this_03,In,(string *)((long)&parent_src.field_2 + 8),1,1,Clock,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk_en","");
  __args = kratos::Generator::port
                     (this_03,In,(string *)((long)&parent_src.field_2 + 8),1,1,ClockEnable,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::sequential((Generator *)&c.tracked_generators_._M_h._M_single_bucket);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar13->super_Var).super_enable_shared_from_this<kratos::Var>);
  parent_src.field_2._8_8_ = parent_src.field_2._8_8_ & 0xffffffff00000000;
  src._M_t._M_impl._0_8_ = child_src.field_2._8_8_;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = parent_src._M_dataplus._M_p;
  child_src.field_2._8_8_ = 0;
  parent_src._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)
             child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::IfStmt,std::allocator<kratos::IfStmt>,kratos::Port&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_child3,
             (IfStmt **)
             &if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (allocator<kratos::IfStmt> *)((long)&parent_src.field_2 + 8),__args);
  std::__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::IfStmt,kratos::IfStmt>
            ((__shared_ptr<kratos::IfStmt,(__gnu_cxx::_Lock_policy)2> *)
             &if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (IfStmt *)
             if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  _Var7 = if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  parent_src.field_2._8_8_ = &src._M_t._M_impl.super__Rb_tree_header;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&parent_src.field_2 + 8),"a","");
  pVVar12 = kratos::Generator::var(this_03,(string *)((long)&parent_src.field_2 + 8),1);
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)auStack_a8,pVVar12);
  child_src.field_2._8_8_ = auStack_a8;
  parent_src._M_dataplus = child_src._M_dataplus;
  auStack_a8 = (undefined1  [8])0x0;
  child_src._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)_Var7._M_pi,(shared_ptr<kratos::Stmt> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  p_Var1 = &src._M_t._M_impl.super__Rb_tree_header;
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)child_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ =
       if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  src._M_t._M_impl._0_8_ =
       if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pvVar2 = &((if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      pvVar2 = &((if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Stmt).super_IRNode.fn_name_ln;
      *(int *)&(pvVar2->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(pvVar2->
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  kratos::StmtBlock::add_stmt
            ((StmtBlock *)c.tracked_generators_._M_h._M_single_bucket,
             (shared_ptr<kratos::Stmt> *)((long)&parent_src.field_2 + 8));
  if (src._M_t._M_impl._0_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)src._M_t._M_impl._0_8_);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"child","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar8->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)((long)&parent_src.field_2 + 8),
             (shared_ptr<kratos::Generator> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"child2","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_02->super_enable_shared_from_this<kratos::Generator>);
  this_01 = src._M_t._M_impl.super__Rb_tree_header._M_node_count;
  kratos::Generator::add_child_generator
            ((Generator *)src._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)((long)&parent_src.field_2 + 8),
             (shared_ptr<kratos::Generator> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"child3","");
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
             (child_src.field_2._M_local_buf + 8),
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &this_03->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            ((Generator *)this_01,(string *)((long)&parent_src.field_2 + 8),
             (shared_ptr<kratos::Generator> *)((long)&child_src.field_2 + 8));
  if (parent_src._M_dataplus._M_p != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parent_src._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::wire((Generator *)this_01,&pPVar10->super_Var,&pPVar9->super_Var);
  kratos::Generator::wire((Generator *)this_01,&pPVar11->super_Var,&pPVar9->super_Var);
  kratos::Generator::wire((Generator *)this_01,&pPVar13->super_Var,&pPVar9->super_Var);
  parent_src.field_2._8_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&parent_src.field_2 + 8),"clk_en","");
  expected_predicate_value = (char *)0x4;
  pPVar9 = kratos::Generator::port
                     ((Generator *)this_01,In,(string *)((long)&parent_src.field_2 + 8),1,1,
                      ClockEnable,false);
  if ((_Rb_tree_header *)parent_src.field_2._8_8_ != p_Var1) {
    operator_delete((void *)parent_src.field_2._8_8_,
                    src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
  }
  kratos::Generator::wire((Generator *)this_01,&__args->super_Var,&pPVar9->super_Var);
  kratos::auto_insert_clock_enable((Generator *)this_01);
  kratos::fix_assignment_type((Generator *)this_01);
  kratos::create_module_instantiation((Generator *)this_01);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&parent_src.field_2 + 8),(kratos *)this_01,top);
  psVar3 = &parent_src._M_string_length;
  child_src.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&child_src.field_2 + 8),"parent","");
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&parent_src.field_2 + 8),(key_type *)((long)&child_src.field_2 + 8));
  auStack_a8[0] = (internal)(iVar14._M_node != (_Base_ptr)&src);
  child_src._M_dataplus._M_p = (pointer)0x0;
  if ((size_type *)child_src.field_2._8_8_ != psVar3) {
    operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
  }
  if (auStack_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar__4.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src.field_2 + 8),(internal *)auStack_a8,
               (AssertionResult *)"src.find(\"parent\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe0,(char *)child_src.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),(Message *)&gtest_ar__4.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    if ((size_type *)child_src.field_2._8_8_ != psVar3) {
      operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&child_src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 child_src._M_dataplus._M_p);
  }
  child_src.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&child_src.field_2 + 8),"child","");
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&parent_src.field_2 + 8),(key_type *)((long)&child_src.field_2 + 8));
  auStack_a8[0] = (internal)(iVar14._M_node != (_Base_ptr)&src);
  child_src._M_dataplus._M_p = (pointer)0x0;
  if ((size_type *)child_src.field_2._8_8_ != psVar3) {
    operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
  }
  if (auStack_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar__4.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src.field_2 + 8),(internal *)auStack_a8,
               (AssertionResult *)"src.find(\"child\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe1,(char *)child_src.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),(Message *)&gtest_ar__4.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    if ((size_type *)child_src.field_2._8_8_ != psVar3) {
      operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&child_src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 child_src._M_dataplus._M_p);
  }
  child_src.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&child_src.field_2 + 8),"child2","");
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&parent_src.field_2 + 8),(key_type *)((long)&child_src.field_2 + 8));
  auStack_a8[0] = (internal)(iVar14._M_node != (_Base_ptr)&src);
  child_src._M_dataplus._M_p = (pointer)0x0;
  if ((size_type *)child_src.field_2._8_8_ != psVar3) {
    operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
  }
  if (auStack_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar__4.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src.field_2 + 8),(internal *)auStack_a8,
               (AssertionResult *)"src.find(\"child2\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe2,(char *)child_src.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),(Message *)&gtest_ar__4.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    if ((size_type *)child_src.field_2._8_8_ != psVar3) {
      operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&child_src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 child_src._M_dataplus._M_p);
  }
  child_src.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&child_src.field_2 + 8),"child3","");
  iVar14 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&parent_src.field_2 + 8),(key_type *)((long)&child_src.field_2 + 8));
  auStack_a8[0] = (internal)(iVar14._M_node != (_Base_ptr)&src);
  child_src._M_dataplus._M_p = (pointer)0x0;
  if ((size_type *)child_src.field_2._8_8_ != psVar3) {
    operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
  }
  if (auStack_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar__4.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src.field_2 + 8),(internal *)auStack_a8,
               (AssertionResult *)"src.find(\"child3\") != src.end()","false","true",
               expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&child_src2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe3,(char *)child_src.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&child_src2.field_2 + 8),(Message *)&gtest_ar__4.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&child_src2.field_2 + 8));
    if ((size_type *)child_src.field_2._8_8_ != psVar3) {
      operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
    }
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (child_src._M_dataplus._M_p != (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&child_src,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 child_src._M_dataplus._M_p);
  }
  psVar4 = &child_src._M_string_length;
  auStack_a8 = (undefined1  [8])psVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_a8,"parent","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&parent_src.field_2 + 8),(key_type *)auStack_a8);
  pcVar6 = (pmVar15->_M_dataplus)._M_p;
  child_src.field_2._8_8_ = psVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&child_src.field_2 + 8),pcVar6,pcVar6 + pmVar15->_M_string_length);
  if (auStack_a8 != (undefined1  [8])psVar4) {
    operator_delete((void *)auStack_a8,child_src._M_string_length + 1);
  }
  psVar5 = &child_src2._M_string_length;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )psVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar__4.message_,"child","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&parent_src.field_2 + 8),(key_type *)&gtest_ar__4.message_);
  pcVar6 = (pmVar15->_M_dataplus)._M_p;
  auStack_a8 = (undefined1  [8])psVar4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)auStack_a8,pcVar6,pcVar6 + pmVar15->_M_string_length);
  if (gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )psVar5) {
    operator_delete((void *)gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,child_src2._M_string_length + 1);
  }
  child_src2.field_2._8_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&child_src2.field_2 + 8),"child2","");
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&parent_src.field_2 + 8),(key_type *)((long)&child_src2.field_2 + 8));
  pcVar6 = (pmVar15->_M_dataplus)._M_p;
  gtest_ar__4.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )psVar5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&gtest_ar__4.message_,pcVar6,pcVar6 + pmVar15->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)child_src2.field_2._8_8_ != &local_c8) {
    operator_delete((void *)child_src2.field_2._8_8_,local_c8._M_allocated_capacity + 1);
  }
  lVar16 = std::__cxx11::string::find(child_src.field_2._M_local_buf + 8,0x2474ba,0);
  if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       lVar16 != -1;
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_7_ = 0;
  if (!(bool)if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src2.field_2 + 8),
               (internal *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (AssertionResult *)"parent_src.find(\"else if (clk_en)\") != std::string::npos",
               "false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe7,(char *)child_src2.field_2._8_8_);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)child_src2.field_2._8_8_ != &local_c8) {
      operator_delete((void *)child_src2.field_2._8_8_,local_c8._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (gtest_ar__4._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__4._0_8_);
  }
  lVar16 = std::__cxx11::string::find(auStack_a8,0x2474bf,0);
  if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       lVar16 != -1;
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_7_ = 0;
  if (!(bool)if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src2.field_2 + 8),
               (internal *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (AssertionResult *)"child_src.find(\"if (clk_en)\") != std::string::npos","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe8,(char *)child_src2.field_2._8_8_);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)child_src2.field_2._8_8_ != &local_c8) {
      operator_delete((void *)child_src2.field_2._8_8_,local_c8._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (gtest_ar__4._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__4._0_8_);
  }
  lVar16 = std::__cxx11::string::find((char *)&gtest_ar__4.message_,0x2474bf,0);
  if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       lVar16 != -1;
  gtest_ar__4.success_ = false;
  gtest_ar__4._1_7_ = 0;
  if (!(bool)if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _0_1_) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&child_src2.field_2 + 8),
               (internal *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (AssertionResult *)"child_src2.find(\"if (clk_en)\") != std::string::npos","false",
               "true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0xe9,(char *)child_src2.field_2._8_8_);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)child_src2.field_2._8_8_ != &local_c8) {
      operator_delete((void *)child_src2.field_2._8_8_,local_c8._M_allocated_capacity + 1);
    }
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if (gtest_ar__4._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar__4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__4._0_8_);
  }
  if (gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )psVar5) {
    operator_delete((void *)gtest_ar__4.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl,child_src2._M_string_length + 1);
  }
  if (auStack_a8 != (undefined1  [8])psVar4) {
    operator_delete((void *)auStack_a8,child_src._M_string_length + 1);
  }
  if ((size_type *)child_src.field_2._8_8_ != psVar3) {
    operator_delete((void *)child_src.field_2._8_8_,parent_src._M_string_length + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&parent_src.field_2 + 8));
  if (if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               if_child3.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (child_seq3.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               child_seq3.
               super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               if_child2.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (child_seq2.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               child_seq2.
               super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               child_seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if (if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               seq.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  std::
  _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.track_generated_);
  std::
  _Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::Generator>_>,_std::hash<std::shared_ptr<kratos::Generator>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&c.enum_defs_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Enum>_>_>_>
               *)&c.max_instance_id_);
  std::
  _Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::Generator_*,_std::pair<const_kratos::Generator_*const,_unsigned_long>,_std::allocator<std::pair<const_kratos::Generator_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Generator_*>,_std::hash<const_kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&c.modules_._M_h._M_single_bucket);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_2c0);
  return;
}

Assistant:

TEST(pass, insert_clk_en) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &a = parent.port(PortDirection::Out, "a", 1);

    auto seq = parent.sequential();
    seq->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
    seq->add_condition({EventEdgeType::Posedge, rst.shared_from_this()});
    auto if_ = std::make_shared<IfStmt>(rst);
    if_->add_then_stmt(a.assign(constant(1, 1)));
    if_->add_else_stmt(a.assign(constant(0, 1)));
    seq->add_stmt(if_);

    // add child generator
    auto &child = c.generator("child");
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto child_seq = child.sequential();
    child_seq->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
    child_seq->add_stmt(child.var("a", 1).assign(constant(1, 1)));
    child_seq->add_stmt(child.var("b", 1).assign(constant(1, 1)));

    // another child generator
    auto &child2 = c.generator("child2");
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child2 = child2.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // always const
    child2.wire(clk_en_child2, constant(1, 1));
    auto child_seq2 = child2.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
    auto if_child2 = std::make_shared<IfStmt>(clk_en_child2);
    if_child2->add_then_stmt(child2.var("a", 1).assign(constant(1, 1)));
    child_seq2->add_stmt(if_child2);

    auto &child3 = c.generator("child3");
    auto &clk_child3 = child3.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &clk_en_child3 = child3.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto child_seq3 = child3.sequential();
    child_seq2->add_condition({EventEdgeType::Posedge, clk_child3.shared_from_this()});
    auto if_child3 = std::make_shared<IfStmt>(clk_en_child3);
    if_child3->add_then_stmt(child3.var("a", 1).assign(constant(1, 1)));
    child_seq3->add_stmt(if_child3);

    parent.add_child_generator("child", child.shared_from_this());
    parent.add_child_generator("child2", child2.shared_from_this());
    parent.add_child_generator("child3", child3.shared_from_this());
    parent.wire(clk_child, clk);
    parent.wire(clk_child2, clk);
    parent.wire(clk_child3, clk);

    // add clock enable
    auto &parent_clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    // wire it to child3
    parent.wire(clk_en_child3, parent_clk_en);
    auto_insert_clock_enable(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);
    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    EXPECT_TRUE(src.find("child3") != src.end());
    auto parent_src = src.at("parent");
    auto child_src = src.at("child");
    auto child_src2 = src.at("child2");
    EXPECT_TRUE(parent_src.find("else if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src.find("if (clk_en)") != std::string::npos);
    EXPECT_TRUE(child_src2.find("if (clk_en)") != std::string::npos);
}